

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_subdiv.cpp
# Opt level: O1

void __thiscall
embree::sse2::BVHNSubdivPatch1MBlurBuilderSAH<4>::countSubPatches
          (BVHNSubdivPatch1MBlurBuilderSAH<4> *this,size_t *numSubPatches,size_t *numSubPatchesMB,
          ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *pstate
          )

{
  Geometry *pGVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  char cVar10;
  int iVar11;
  ulong uVar12;
  runtime_error *this_00;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  BBox1f *pBVar23;
  Iterator<embree::SubdivMesh,_true> iter;
  size_t taskCount;
  task_group_context context;
  anon_class_1_0_00000001 local_1bb;
  undefined1 local_1ba [2];
  Iterator<embree::GridMesh,_false> local_1b8;
  unsigned_long *local_1a8;
  unsigned_long local_1a0;
  anon_class_8_1_4d25ca37_conflict local_198;
  anon_class_8_1_898bcfc2_conflict10 local_190;
  anon_class_16_2_341d598e_conflict2 local_188;
  task_group_context local_178;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  unsigned_long local_98;
  unsigned_long uStack_90;
  size_t local_88;
  size_t sStack_80;
  float local_78;
  undefined8 uStack_74;
  float fStack_6c;
  anon_class_48_6_afa08d2e_conflict2 local_60;
  
  local_1b8.scene = this->scene;
  local_1b8.all = false;
  sVar19 = ((local_1b8.scene)->geometries).size_active;
  if (sVar19 == 0) {
    uVar20 = 0;
  }
  else {
    uVar20 = 0;
    sVar15 = 0;
    do {
      pGVar1 = ((local_1b8.scene)->geometries).items[sVar15].ptr;
      if ((((pGVar1 == (Geometry *)0x0) || (((pGVar1->field_8).field_0x2 & 0x20) == 0)) ||
          (*(char *)&pGVar1->field_8 != '\x17')) || (pGVar1->numTimeSteps == 1)) {
        uVar13 = 0;
      }
      else {
        uVar13 = (ulong)pGVar1->numPrimitives;
      }
      uVar20 = uVar20 + uVar13;
      sVar15 = sVar15 + 1;
    } while (sVar19 != sVar15);
  }
  (pstate->super_ParallelForForState).N = uVar20;
  local_1a8 = numSubPatchesMB;
  iVar11 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar13 = uVar20 + 0x3ff >> 10;
  if ((ulong)(long)iVar11 < uVar13) {
    uVar13 = (long)iVar11;
  }
  uVar21 = 0x40;
  if (uVar13 < 0x40) {
    uVar21 = uVar13;
  }
  uVar21 = uVar21 + (uVar21 == 0);
  (pstate->super_ParallelForForState).taskCount = uVar21;
  (pstate->super_ParallelForForState).i0[0] = 0;
  (pstate->super_ParallelForForState).j0[0] = 0;
  if (1 < uVar13) {
    uVar17 = 0;
    uVar13 = uVar20 / uVar21;
    uVar18 = 1;
    sVar19 = 0;
    do {
      pGVar1 = ((local_1b8.scene)->geometries).items[sVar19].ptr;
      if ((((pGVar1 == (Geometry *)0x0) ||
           (((local_1b8.all & 1U) == 0 && (((pGVar1->field_8).field_0x2 & 0x20) == 0)))) ||
          (*(char *)&pGVar1->field_8 != '\x17')) || (pGVar1->numTimeSteps == 1)) {
        uVar21 = 0;
      }
      else {
        uVar21 = (ulong)pGVar1->numPrimitives;
      }
      if (uVar21 == 0) {
        lVar16 = 0;
      }
      else {
        uVar14 = (uVar18 + 1) * uVar20;
        lVar16 = 0;
        uVar22 = 0;
        do {
          uVar12 = uVar13;
          uVar13 = uVar12;
          if ((uVar17 + uVar21 + lVar16 < uVar12) ||
             ((pstate->super_ParallelForForState).taskCount <= uVar18)) break;
          (pstate->super_ParallelForForState).i0[uVar18] = sVar19;
          uVar22 = uVar22 + (uVar12 - uVar17);
          (pstate->super_ParallelForForState).j0[uVar18] = uVar22;
          uVar18 = uVar18 + 1;
          uVar13 = uVar14 / (pstate->super_ParallelForForState).taskCount;
          lVar16 = -uVar22;
          uVar14 = uVar14 + uVar20;
          uVar17 = uVar12;
        } while (uVar22 < uVar21);
      }
      uVar17 = uVar17 + uVar21 + lVar16;
      sVar19 = sVar19 + 1;
      uVar21 = (pstate->super_ParallelForForState).taskCount;
    } while (uVar18 < uVar21);
  }
  local_60.identity = (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_f8;
  local_f8 = (undefined1  [8])0x7f8000007f800000;
  uStack_f0 = 0x7f8000007f800000;
  local_e8 = 0xff800000ff800000;
  uStack_e0 = 0xff800000ff800000;
  local_d8 = 0x7f8000007f800000;
  uStack_d0 = 0x7f8000007f800000;
  local_c8 = 0xff800000ff800000;
  uStack_c0 = 0xff800000ff800000;
  local_b8 = 0x7f8000007f800000;
  uStack_b0 = 0x7f8000007f800000;
  local_a8 = 0xff800000ff800000;
  uStack_a0 = 0xff800000ff800000;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_78 = 0.0;
  uStack_74 = &DAT_3f8000003f800000;
  fStack_6c = 0.0;
  local_198.array2 = &local_1b8;
  local_60.getSize = &local_198;
  local_188.func = (anon_class_8_1_89912a77 *)local_1ba;
  local_60.func = &local_188;
  local_60.taskCount = &local_1a0;
  local_60.reduction = &local_1bb;
  local_178._12_2_ = 0x401;
  local_178.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_178.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_178.my_name = CUSTOM_CTX;
  local_1a0 = uVar21;
  local_188.array2 = (Iterator<embree::GridMesh,_true> *)local_198.array2;
  local_60.state = pstate;
  tbb::detail::r1::initialize(&local_178);
  local_190.func = &local_60;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,uVar21,1,&local_190,(auto_partitioner *)(local_1ba + 1),&local_178);
  cVar10 = tbb::detail::r1::is_group_execution_cancelled(&local_178);
  if (cVar10 != '\0') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"task cancelled");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_178);
  local_178.my_cpu_ctl_env = local_88;
  local_178.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i =
       (__atomic_base<unsigned_int>)(__atomic_base<unsigned_int>)(undefined4)sStack_80;
  local_178.my_version = sStack_80._4_1_;
  local_178.my_traits = (context_traits)sStack_80._5_1_;
  local_178.my_state.super___atomic_base<unsigned_char>._M_i =
       (__atomic_base<unsigned_char>)(__atomic_base<unsigned_char>)sStack_80._6_1_;
  local_178.my_lifetime_state._M_i = sStack_80._7_1_;
  if (local_1a0 != 0) {
    pBVar23 = &(pstate->prefix_state).sums[0].max_time_range;
    fVar2 = INFINITY;
    fVar3 = INFINITY;
    uVar4 = 0x7f800000;
    uVar5 = 0x7f800000;
    fVar6 = -INFINITY;
    fVar7 = -INFINITY;
    uVar8 = 0xff800000;
    uVar9 = 0xff800000;
    do {
      (((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)(pBVar23 + -0x10))->
      super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.field_0.m128[0] =
           (float)local_f8._0_4_;
      (((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)(pBVar23 + -0x10))->
      super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.field_0.m128[1] =
           (float)local_f8._4_4_;
      pBVar23[-0xf].lower = (undefined4)uStack_f0;
      *(undefined4 *)((long)(pBVar23 + -0xf) + 4) = uStack_f0._4_4_;
      (((Vec3fa *)(pBVar23 + -0xe))->field_0).m128[0] = (float)local_e8;
      (((Vec3fa *)(pBVar23 + -0xe))->field_0).m128[1] = local_e8._4_4_;
      pBVar23[-0xd].lower = (undefined4)uStack_e0;
      *(undefined4 *)((long)(pBVar23 + -0xd) + 4) = uStack_e0._4_4_;
      (((BBox<embree::Vec3fa> *)(pBVar23 + -0xc))->lower).field_0.m128[0] = (float)local_d8;
      (((BBox<embree::Vec3fa> *)(pBVar23 + -0xc))->lower).field_0.m128[1] = local_d8._4_4_;
      pBVar23[-0xb].lower = (undefined4)uStack_d0;
      *(undefined4 *)((long)(pBVar23 + -0xb) + 4) = uStack_d0._4_4_;
      (((Vec3fa *)(pBVar23 + -10))->field_0).m128[0] = (float)local_c8;
      (((Vec3fa *)(pBVar23 + -10))->field_0).m128[1] = local_c8._4_4_;
      pBVar23[-9].lower = (undefined4)uStack_c0;
      *(undefined4 *)((long)(pBVar23 + -9) + 4) = uStack_c0._4_4_;
      (((BBox3fa *)(pBVar23 + -8))->lower).field_0.m128[0] = (float)local_b8;
      (((BBox3fa *)(pBVar23 + -8))->lower).field_0.m128[1] = local_b8._4_4_;
      pBVar23[-7].lower = (undefined4)uStack_b0;
      *(undefined4 *)((long)(pBVar23 + -7) + 4) = uStack_b0._4_4_;
      (((Vec3fa *)(pBVar23 + -6))->field_0).m128[0] = (float)local_a8;
      (((Vec3fa *)(pBVar23 + -6))->field_0).m128[1] = local_a8._4_4_;
      pBVar23[-5].lower = (undefined4)uStack_a0;
      *(undefined4 *)((long)(pBVar23 + -5) + 4) = uStack_a0._4_4_;
      ((range<unsigned_long> *)(pBVar23 + -4))->_begin = local_98;
      pBVar23[-3] = (BBox1f)uStack_90;
      pBVar23[-2] = (BBox1f)local_178.my_cpu_ctl_env;
      pBVar23[-1] = (BBox1f)local_178._8_8_;
      pBVar23->lower = local_78;
      pBVar23->upper = (float)uStack_74;
      pBVar23[1].lower = uStack_74._4_4_;
      pBVar23[1].upper = fStack_6c;
      local_98 = local_98 + *(long *)(pBVar23 + -0x484);
      uStack_90 = uStack_90 + *(long *)(pBVar23 + -0x483);
      local_178.my_cpu_ctl_env = 0;
      local_178.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i =
           (__atomic_base<unsigned_int>)0x0;
      local_178.my_version = gold_2021U1;
      local_178.my_traits = (context_traits)0x0;
      local_178.my_state.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)0x0
      ;
      local_178.my_lifetime_state._M_i = created;
      pBVar23 = pBVar23 + 0x12;
      local_1a0 = local_1a0 - 1;
      local_f8._0_4_ = fVar2;
      local_f8._4_4_ = fVar3;
      uStack_f0._0_4_ = uVar4;
      uStack_f0._4_4_ = uVar5;
      local_e8._0_4_ = fVar6;
      local_e8._4_4_ = fVar7;
      uStack_e0._0_4_ = uVar8;
      uStack_e0._4_4_ = uVar9;
      local_d8._0_4_ = fVar2;
      local_d8._4_4_ = fVar3;
      uStack_d0._0_4_ = uVar4;
      uStack_d0._4_4_ = uVar5;
      local_c8._0_4_ = fVar6;
      local_c8._4_4_ = fVar7;
      uStack_c0._0_4_ = uVar8;
      uStack_c0._4_4_ = uVar9;
      local_b8._0_4_ = fVar2;
      local_b8._4_4_ = fVar3;
      uStack_b0._0_4_ = uVar4;
      uStack_b0._4_4_ = uVar5;
      local_a8._0_4_ = fVar6;
      local_a8._4_4_ = fVar7;
      uStack_a0._0_4_ = uVar8;
      uStack_a0._4_4_ = uVar9;
      local_78 = 0.0;
      uStack_74._0_4_ = 1.0;
      uStack_74._4_4_ = 1.0;
      fStack_6c = 0.0;
    } while (local_1a0 != 0);
  }
  *numSubPatches = local_98;
  *local_1a8 = uStack_90;
  return;
}

Assistant:

void countSubPatches(size_t& numSubPatches, size_t& numSubPatchesMB, ParallelForForPrefixSumState<PrimInfoMB>& pstate)
      {
        Scene::Iterator<SubdivMesh,true> iter(scene);
        pstate.init(iter,size_t(1024));

        PrimInfoMB pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfoMB(empty), [&](SubdivMesh* mesh, const range<size_t>& r, size_t k, size_t /*geomID*/) -> PrimInfoMB
        { 
          size_t s = 0;
          size_t sMB = 0;
          for (size_t f=r.begin(); f!=r.end(); ++f) 
          {          
            if (!mesh->valid(f)) continue;
            size_t count = patch_eval_subdivision_count(mesh->getHalfEdge(0,f));
            s += count;
            sMB += count * mesh->numTimeSteps;
          }
          return PrimInfoMB(s,sMB);
        }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB(a.begin()+b.begin(),a.end()+b.end()); });

        numSubPatches = pinfo.begin();
        numSubPatchesMB = pinfo.end();
      }